

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O2

void __thiscall
fileStoreFixture::fileStoreFixture(fileStoreFixture *this,bool resetBefore,bool reset)

{
  MessageStore *pMVar1;
  SessionID sessionID;
  allocator<char> local_334;
  allocator<char> local_333;
  allocator<char> local_332;
  allocator<char> local_331;
  string local_330;
  STRING local_310;
  STRING local_2f0;
  STRING local_2d0;
  string local_2b0;
  string local_290;
  undefined1 local_270 [264];
  SessionID local_168;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_270 + 0x108),"store",(allocator<char> *)local_270);
  FIX::FileStoreFactory::FileStoreFactory(&this->factory,(string *)(local_270 + 0x108));
  std::__cxx11::string::~string((string *)(local_270 + 0x108));
  if (resetBefore) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"SETGET",(allocator<char> *)(local_270 + 0x108));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b0,"TEST",(allocator<char> *)local_270);
    FIX::deleteSession(&local_290,&local_2b0);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,"FIX.4.2",&local_331);
  FIX::BeginString::BeginString((BeginString *)local_270,&local_2d0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f0,"SETGET",&local_332);
  FIX::SenderCompID::SenderCompID((SenderCompID *)(local_270 + 0xb0),&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,"TEST",&local_333);
  FIX::TargetCompID::TargetCompID((TargetCompID *)(local_270 + 0x58),&local_310);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"",&local_334);
  FIX::SessionID::SessionID
            ((SessionID *)(local_270 + 0x108),(string *)(local_270 + 0x10),
             (string *)(local_270 + 0xc0),(string *)(local_270 + 0x68),&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  FIX::FieldBase::~FieldBase((FieldBase *)(local_270 + 0x58));
  std::__cxx11::string::~string((string *)&local_310);
  FIX::FieldBase::~FieldBase((FieldBase *)(local_270 + 0xb0));
  std::__cxx11::string::~string((string *)&local_2f0);
  FIX::FieldBase::~FieldBase((FieldBase *)local_270);
  std::__cxx11::string::~string((string *)&local_2d0);
  FIX::UtcTimeStamp::now();
  pMVar1 = (MessageStore *)
           FIX::FileStoreFactory::create((UtcTimeStamp *)this,(SessionID *)local_270);
  this->object = pMVar1;
  this->resetAfter = reset;
  FIX::SessionID::~SessionID((SessionID *)(local_270 + 0x108));
  return;
}

Assistant:

fileStoreFixture(bool resetBefore, bool reset)
      : factory("store") {
    if (resetBefore) {
      deleteSession("SETGET", "TEST");
    }

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("SETGET"), TargetCompID("TEST"));

    object = factory.create(UtcTimeStamp::now(), sessionID);

    this->resetAfter = reset;
  }